

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_decomposer.hpp
# Opt level: O1

void __thiscall
Catch::BinaryExpr<const_std::optional<unsigned_char>_&,_const_std::nullopt_t_&>::
streamReconstructedExpression
          (BinaryExpr<const_std::optional<unsigned_char>_&,_const_std::nullopt_t_&> *this,
          ostream *os)

{
  optional<unsigned_char> *in_RDX;
  string *in_R9;
  StringRef op;
  undefined4 *local_58;
  undefined8 local_50;
  undefined4 local_48;
  undefined4 uStack_44;
  string local_38;
  
  StringMaker<std::optional<unsigned_char>,void>::convert_abi_cxx11_
            (&local_38,(StringMaker<std::optional<unsigned_char>,void> *)this->m_lhs,in_RDX);
  local_48 = 0x7d207b;
  local_50 = 3;
  op.m_size = (size_type)&local_58;
  op.m_start = (char *)(this->m_op).m_size;
  local_58 = &local_48;
  formatReconstructedExpression
            ((Catch *)os,(ostream *)&local_38,(string *)(this->m_op).m_start,op,in_R9);
  if (local_58 != &local_48) {
    operator_delete(local_58,CONCAT44(uStack_44,local_48) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void streamReconstructedExpression( std::ostream &os ) const override {
            formatReconstructedExpression
                    ( os, Catch::Detail::stringify( m_lhs ), m_op, Catch::Detail::stringify( m_rhs ) );
        }